

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O2

int archive_read_append_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char **ppcVar4;
  
  iVar1 = archive_read_support_filter_program_signature(_a,cmd,signature,signature_len);
  if (iVar1 == 0) {
    ppcVar4 = &_a[8].compression_name;
    for (lVar2 = 0x108; (int)lVar2 != 0x3a8; lVar2 = lVar2 + 0x30) {
      if ((*(long *)((long)&_a->magic + lVar2) != 0) && (*(long *)((long)&_a->vtable + lVar2) == 0))
      {
        ppcVar4 = (char **)((long)&_a->magic + lVar2);
        goto LAB_0011aaa4;
      }
    }
    if (*ppcVar4 == (char *)0x0) {
      pcVar3 = "Internal error: Unable to append program filter";
      iVar1 = 0x16;
    }
    else {
LAB_0011aaa4:
      pcVar3 = (char *)calloc(1,0xb0);
      if (pcVar3 != (char *)0x0) {
        *(char ***)(pcVar3 + 8) = ppcVar4;
        *(archive **)(pcVar3 + 0x18) = _a;
        *(char **)(pcVar3 + 0x10) = _a[8].compression_name;
        _a[8].compression_name = pcVar3;
        iVar1 = (*(code *)((archive_string *)(ppcVar4 + 3))->s)(pcVar3);
        if (iVar1 != 0) {
          __archive_read_close_filters((archive_read *)_a);
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
        ppcVar4[1] = (char *)*(undefined8 *)(_a[8].compression_name + 0x58);
        _a[8].file_count = 1;
        return 0;
      }
      pcVar3 = "Out of memory";
      iVar1 = 0xc;
    }
    archive_set_error(_a,iVar1,pcVar3);
  }
  return -0x1e;
}

Assistant:

int
archive_read_append_filter_program_signature(struct archive *_a,
  const char *cmd, const void *signature, size_t signature_len)
{
  int r, number_bidders, i;
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  if (archive_read_support_filter_program_signature(_a, cmd, signature,
    signature_len) != (ARCHIVE_OK))
    return (ARCHIVE_FATAL);

  number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

  bidder = a->bidders;
  for (i = 0; i < number_bidders; i++, bidder++)
  {
    /* Program bidder name set to filter name after initialization */
    if (bidder->data && !bidder->name)
      break;
  }
  if (!bidder->data)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to append program filter");
    return (ARCHIVE_FATAL);
  }

  filter
      = (struct archive_read_filter *)calloc(1, sizeof(*filter));
  if (filter == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Out of memory");
    return (ARCHIVE_FATAL);
  }
  filter->bidder = bidder;
  filter->archive = a;
  filter->upstream = a->filter;
  a->filter = filter;
  r = (bidder->init)(a->filter);
  if (r != ARCHIVE_OK) {
    __archive_read_close_filters(a);
    __archive_read_free_filters(a);
    return (ARCHIVE_FATAL);
  }
  bidder->name = a->filter->name;

  a->bypass_filter_bidding = 1;
  return r;
}